

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

PMap * NewMap(PType *keytype,PType *valuetype)

{
  PMap *this;
  size_t bucket;
  size_t local_20;
  
  this = (PMap *)FTypeTable::FindType
                           (&TypeTable,PMap::RegistrationInfo.MyClass,(intptr_t)keytype,
                            (intptr_t)valuetype,&local_20);
  if (this == (PMap *)0x0) {
    this = (PMap *)M_Malloc_Dbg(0x90,
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                                ,0x1f7);
    PType::PType((PType *)this);
    (this->super_PCompoundType).super_PType.super_DObject._vptr_DObject =
         (_func_int **)&PTR_StaticType_00847050;
    this->KeyType = keytype;
    this->ValueType = valuetype;
    *(undefined8 *)&(this->super_PCompoundType).super_PType.super_DObject.field_0x24 = 0x800000018;
    FTypeTable::AddType(&TypeTable,(PType *)this,PMap::RegistrationInfo.MyClass,(intptr_t)keytype,
                        (intptr_t)valuetype,local_20);
  }
  return this;
}

Assistant:

PMap *NewMap(PType *keytype, PType *valuetype)
{
	size_t bucket;
	PType *maptype = TypeTable.FindType(RUNTIME_CLASS(PMap), (intptr_t)keytype, (intptr_t)valuetype, &bucket);
	if (maptype == NULL)
	{
		maptype = new PMap(keytype, valuetype);
		TypeTable.AddType(maptype, RUNTIME_CLASS(PMap), (intptr_t)keytype, (intptr_t)valuetype, bucket);
	}
	return (PMap *)maptype;
}